

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

int define_kf_interval(AV1_COMP *cpi,FIRSTPASS_INFO *firstpass_info,
                      int num_frames_to_detect_scenecut,int search_start_idx)

{
  int offset_from_cur;
  int iVar1;
  aom_rc_mode aVar2;
  AV1_PRIMARY *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  FIRSTPASS_INFO *firstpass_info_00;
  FIRSTPASS_STATS *pFVar11;
  FIRSTPASS_STATS *pFVar12;
  FIRSTPASS_STATS *pFVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  uint uVar18;
  uint uVar19;
  uint frame_interval;
  bool bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double recent_loop_decay [8];
  double local_e8;
  double adStack_78 [9];
  
  pAVar3 = cpi->ppi;
  iVar16 = (cpi->rc).frames_since_key;
  iVar4 = is_forced_keyframe_pending
                    (pAVar3->lookahead,pAVar3->lookahead->max_sz,cpi->compressor_stage);
  if (num_frames_to_detect_scenecut == 0) {
    if (iVar4 == -1) {
      iVar4 = (cpi->rc).frames_to_key;
    }
  }
  else {
    iVar16 = iVar16 + 1;
    iVar14 = num_frames_to_detect_scenecut;
    if (iVar4 < num_frames_to_detect_scenecut) {
      iVar14 = iVar4;
    }
    lVar9 = 0;
    do {
      adStack_78[lVar9] = 1.0;
      adStack_78[lVar9 + 1] = 1.0;
      lVar9 = lVar9 + 2;
    } while (lVar9 != 8);
    if (iVar4 == -1) {
      iVar14 = num_frames_to_detect_scenecut;
    }
    piVar10 = &cpi->initial_mbs;
    if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
      piVar10 = &(cpi->common).mi_params.MBs;
    }
    iVar1 = *piVar10;
    frame_interval = 0;
    iVar5 = av1_firstpass_info_future_count(firstpass_info,0);
    if (iVar5 < iVar14) {
      iVar14 = iVar5;
    }
    if (search_start_idx < iVar14) {
      firstpass_info_00 = &(pAVar3->twopass).firstpass_info;
      bVar20 = false;
      do {
        iVar8 = (cpi->ppi->p_rc).enable_scenecut_detection;
        if (((iVar8 < 1) || ((cpi->oxcf).kf_cfg.auto_key != true)) ||
           (offset_from_cur = search_start_idx + 1, iVar5 <= offset_from_cur)) {
          search_start_idx = search_start_idx + 1;
          iVar16 = iVar16 + 1;
        }
        else {
          bVar17 = bVar20;
          if (iVar16 < (cpi->oxcf).kf_cfg.key_freq_min) {
LAB_001f2dec:
            pFVar11 = av1_firstpass_info_peek(firstpass_info,offset_from_cur);
            dVar22 = get_prediction_decay_rate(pFVar11);
            adStack_78[frame_interval & 7] = dVar22;
            lVar9 = 0;
            dVar24 = 1.0;
            do {
              dVar24 = dVar24 * adStack_78[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 8);
            bVar20 = bVar17;
            if ((cpi->oxcf).kf_cfg.key_freq_min <= iVar16) {
              iVar8 = detect_transition_to_still
                                (firstpass_info,offset_from_cur,(cpi->rc).min_gf_interval,
                                 frame_interval,(cpi->oxcf).kf_cfg.key_freq_max - frame_interval,
                                 dVar22,dVar24);
              if (iVar8 != 0) {
                (pAVar3->p_rc).use_arf_in_this_kf_group = 0;
                bVar20 = true;
                bVar17 = false;
                goto LAB_001f2e9a;
              }
              bVar20 = false;
            }
            iVar16 = iVar16 + 1;
            bVar17 = offset_from_cur < (cpi->oxcf).kf_cfg.key_freq_max * 2;
            search_start_idx = offset_from_cur;
          }
          else {
            aVar2 = (cpi->oxcf).rc_cfg.mode;
            pFVar11 = av1_firstpass_info_peek(firstpass_info_00,search_start_idx + -1);
            pFVar12 = av1_firstpass_info_peek(firstpass_info_00,search_start_idx);
            pFVar13 = av1_firstpass_info_peek(firstpass_info_00,offset_from_cur);
            bVar20 = false;
            if (pFVar13 != (FIRSTPASS_STATS *)0x0 &&
                (pFVar12 != (FIRSTPASS_STATS *)0x0 && pFVar11 != (FIRSTPASS_STATS *)0x0)) {
              dVar22 = 0.12000000000000001;
              if (iVar16 < 0x20) {
                dVar22 = ((double)iVar16 / 31.0) * 0.035 + 0.085;
              }
              dVar24 = pFVar12->pcnt_inter;
              dVar21 = dVar24 - pFVar12->pcnt_neutral;
              iVar6 = av1_firstpass_info_future_count(firstpass_info_00,search_start_idx);
              if (iVar8 == 1) {
                bVar20 = false;
                if (iVar6 < 4) goto LAB_001f2dd7;
                uVar18 = 1;
                uVar15 = 3;
              }
              else {
                uVar18 = 3;
                uVar15 = 0x10;
              }
              uVar19 = iVar6 - 1U;
              if ((int)uVar15 < (int)(iVar6 - 1U)) {
                uVar19 = uVar15;
              }
              if (((2 < iVar16) || (bVar20 = false, aVar2 != AOM_Q)) &&
                 ((bVar20 = false,
                  pFVar12->pcnt_second_ref <= dVar22 && dVar22 != pFVar12->pcnt_second_ref &&
                  (pFVar13->pcnt_second_ref <= dVar22 && dVar22 != pFVar13->pcnt_second_ref)))) {
                if (0.05 < pFVar12->pcnt_inter || pFVar12->pcnt_inter == 0.05) {
                  dVar22 = pFVar12->intra_error;
                  dVar23 = pFVar12->coded_error;
                  if (((dVar23 * 1.5 <= dVar22) || (dVar23 <= pFVar11->coded_error * 5.0)) ||
                     (dVar23 <= pFVar13->coded_error * 5.0)) {
                    dVar24 = 1.0 - dVar24;
                    bVar20 = false;
                    if ((0.25 < dVar24) && (dVar21 + dVar21 < dVar24)) {
                      bVar20 = false;
                      if ((dVar22 / (*(double *)(&DAT_004dbc00 + (ulong)(dVar23 < 0.0) * 8) + dVar23
                                    ) < 1.9) &&
                         (((0.4 < ABS(pFVar11->coded_error - dVar23) /
                                  (*(double *)(&DAT_004dbc00 + (ulong)(dVar23 < 0.0) * 8) + dVar23)
                           || (0.4 < ABS(pFVar11->intra_error - dVar22) /
                                     (dVar22 + *(double *)
                                                (&DAT_004dbc00 + (ulong)(dVar22 < 0.0) * 8)))) ||
                          (bVar20 = false,
                          3.5 < pFVar13->intra_error /
                                (pFVar13->coded_error +
                                *(double *)(&DAT_004dbc00 + (ulong)(pFVar13->coded_error < 0.0) * 8)
                                ))))) goto LAB_001f2ade;
                    }
                    goto LAB_001f2dd7;
                  }
                }
LAB_001f2ade:
                if (iVar6 < 2) {
                  uVar7 = 1;
                  bVar20 = false;
                }
                else {
                  local_e8 = 0.0;
                  dVar22 = 1.0;
                  dVar24 = 0.0;
                  uVar15 = 1;
                  do {
                    pFVar11 = av1_firstpass_info_peek(firstpass_info_00,search_start_idx + uVar15);
                    dVar23 = (pFVar11->intra_error * 12.5) /
                             (pFVar11->coded_error +
                             *(double *)(&DAT_004dbc00 + (ulong)(pFVar11->coded_error < 0.0) * 8));
                    dVar21 = 128.0;
                    if (dVar23 <= 128.0) {
                      dVar21 = dVar23;
                    }
                    dVar23 = pFVar11->pcnt_inter;
                    dVar22 = (double)(~-(ulong)(0.85 < dVar23) & (ulong)((dVar23 + 0.85) * 0.5) |
                                     -(ulong)(0.85 < dVar23) & (ulong)dVar23) * dVar22;
                    dVar24 = dVar22 * dVar21 + dVar24;
                    bVar20 = false;
                    if ((0.05 <= dVar23) && (1.5 <= dVar21)) {
                      bVar20 = false;
                      if ((200.0 / (double)iVar1 <= pFVar11->intra_error) &&
                         ((bVar20 = false, 3.0 <= dVar21 || 0.2 <= dVar23 - pFVar11->pcnt_neutral &&
                          (3.0 <= dVar24 - local_e8)))) {
                        bVar20 = true;
                        local_e8 = dVar24;
                      }
                    }
                    uVar7 = uVar15;
                  } while ((bVar20) &&
                          (uVar7 = uVar15 + 1, bVar20 = uVar15 != uVar19, uVar15 = uVar7, bVar20));
                  bVar20 = 30.0 < dVar24;
                }
                bVar20 = (bool)(uVar18 < uVar7 & bVar20);
              }
            }
LAB_001f2dd7:
            bVar17 = false;
            if (!bVar20) goto LAB_001f2dec;
          }
LAB_001f2e9a:
          if (bVar17 == false) break;
        }
        frame_interval = frame_interval + 1;
      } while (search_start_idx < iVar14);
      frame_interval = (uint)bVar20;
    }
    if (frame_interval != 0) {
      iVar4 = search_start_idx;
    }
    if (cpi->ppi->lap_enabled == 0) {
      iVar4 = search_start_idx;
    }
  }
  return iVar4;
}

Assistant:

static int define_kf_interval(AV1_COMP *cpi,
                              const FIRSTPASS_INFO *firstpass_info,
                              int num_frames_to_detect_scenecut,
                              int search_start_idx) {
  const TWO_PASS *const twopass = &cpi->ppi->twopass;
  const RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const KeyFrameCfg *const kf_cfg = &oxcf->kf_cfg;
  double recent_loop_decay[FRAMES_TO_CHECK_DECAY];
  double decay_accumulator = 1.0;
  int i = 0, j;
  int frames_to_key = search_start_idx;
  int frames_since_key = rc->frames_since_key + 1;
  int scenecut_detected = 0;

  int num_frames_to_next_key = detect_app_forced_key(cpi);

  if (num_frames_to_detect_scenecut == 0) {
    if (num_frames_to_next_key != -1)
      return num_frames_to_next_key;
    else
      return rc->frames_to_key;
  }

  if (num_frames_to_next_key != -1)
    num_frames_to_detect_scenecut =
        AOMMIN(num_frames_to_detect_scenecut, num_frames_to_next_key);

  // Initialize the decay rates for the recent frames to check
  for (j = 0; j < FRAMES_TO_CHECK_DECAY; ++j) recent_loop_decay[j] = 1.0;

  i = 0;
  const int num_mbs = (oxcf->resize_cfg.resize_mode != RESIZE_NONE)
                          ? cpi->initial_mbs
                          : cpi->common.mi_params.MBs;
  const int future_stats_count =
      av1_firstpass_info_future_count(firstpass_info, 0);
  while (frames_to_key < future_stats_count &&
         frames_to_key < num_frames_to_detect_scenecut) {
    // Provided that we are not at the end of the file...
    if ((cpi->ppi->p_rc.enable_scenecut_detection > 0) && kf_cfg->auto_key &&
        frames_to_key + 1 < future_stats_count) {
      double loop_decay_rate;

      // Check for a scene cut.
      if (frames_since_key >= kf_cfg->key_freq_min) {
        scenecut_detected = test_candidate_kf(
            &twopass->firstpass_info, frames_to_key, frames_since_key,
            oxcf->rc_cfg.mode, cpi->ppi->p_rc.enable_scenecut_detection,
            num_mbs);
        if (scenecut_detected) {
          break;
        }
      }

      // How fast is the prediction quality decaying?
      const FIRSTPASS_STATS *next_stats =
          av1_firstpass_info_peek(firstpass_info, frames_to_key + 1);
      loop_decay_rate = get_prediction_decay_rate(next_stats);

      // We want to know something about the recent past... rather than
      // as used elsewhere where we are concerned with decay in prediction
      // quality since the last GF or KF.
      recent_loop_decay[i % FRAMES_TO_CHECK_DECAY] = loop_decay_rate;
      decay_accumulator = 1.0;
      for (j = 0; j < FRAMES_TO_CHECK_DECAY; ++j)
        decay_accumulator *= recent_loop_decay[j];

      // Special check for transition or high motion followed by a
      // static scene.
      if (frames_since_key >= kf_cfg->key_freq_min) {
        scenecut_detected = detect_transition_to_still(
            firstpass_info, frames_to_key + 1, rc->min_gf_interval, i,
            kf_cfg->key_freq_max - i, loop_decay_rate, decay_accumulator);
        if (scenecut_detected) {
          // In the case of transition followed by a static scene, the key frame
          // could be a good predictor for the following frames, therefore we
          // do not use an arf.
          p_rc->use_arf_in_this_kf_group = 0;
          break;
        }
      }

      // Step on to the next frame.
      ++frames_to_key;
      ++frames_since_key;

      // If we don't have a real key frame within the next two
      // key_freq_max intervals then break out of the loop.
      if (frames_to_key >= 2 * kf_cfg->key_freq_max) {
        break;
      }
    } else {
      ++frames_to_key;
      ++frames_since_key;
    }
    ++i;
  }
  if (cpi->ppi->lap_enabled && !scenecut_detected)
    frames_to_key = num_frames_to_next_key;

  return frames_to_key;
}